

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::SideShapeFunction
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  TPZVec<double> *param;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  MElementType MVar6;
  uint uVar7;
  long lVar8;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar9;
  uint uVar10;
  int64_t size;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  TPZFMatrix<double> *pTVar17;
  long lVar18;
  undefined1 auVar19 [16];
  REAL detjac;
  TPZManVector<int,_9> ord;
  TPZGeoElSide gelside;
  TPZManVector<int,_9> permutegather;
  TPZManVector<long,_8> id;
  TPZManVector<long,_28> FirstIndex;
  REAL local_960;
  ulong local_958;
  TPZFMatrix<double> *local_950;
  long local_948;
  TPZVec<double> *local_940;
  TPZFMatrix<double> *local_938;
  undefined8 local_930;
  TPZVec<int> local_928;
  uint local_908 [10];
  TPZGeoElSide local_8e0;
  TPZManVector<int,_9> local_8c8;
  TPZManVector<long,_8> local_880;
  undefined1 local_820 [88];
  int local_7c8 [6];
  undefined **local_7b0;
  undefined1 local_7a8 [16];
  int64_t local_798;
  double local_790 [10];
  TPZManVector<long,_28> local_740;
  undefined1 local_640 [88];
  int local_5e8 [6];
  undefined **local_5d0;
  undefined1 local_5c8 [16];
  int64_t local_5b8;
  double local_5b0 [10];
  undefined1 local_560 [88];
  int local_508 [6];
  undefined **local_4f0;
  undefined1 local_4e8 [16];
  int64_t local_4d8;
  double local_4d0 [10];
  undefined1 local_480 [88];
  int local_428 [6];
  undefined **local_410;
  undefined1 local_408 [16];
  int64_t local_3f8;
  double local_3f0 [51];
  undefined1 local_258 [88];
  int local_200 [6];
  undefined **local_1e8;
  undefined1 local_1e0 [16];
  int64_t local_1d0;
  double local_1c8 [51];
  
  local_950 = dphi;
  if ((side == 9) || (point->fNElements != 1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Don\'t have side shape associated to this side",0x2d);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x1cf);
  }
  iVar2 = pztopology::TPZQuadrilateral::SideDimension(side);
  if (iVar2 == 1) {
    local_940 = point;
    local_938 = phi;
    iVar2 = pztopology::TPZQuadrilateral::NContainedSides(side);
    iVar15 = 0;
    uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x250))(this,0,side);
    lVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar3);
    uVar10 = (uint)*(byte *)(lVar8 + 0x14);
    if (0 < iVar2) {
      iVar15 = 0;
      iVar12 = 0;
      do {
        iVar4 = pztopology::TPZQuadrilateral::ContainedSideLocId(side,iVar12);
        iVar4 = pzshape::TPZShapeQuad::NConnectShapeF(iVar4,uVar10);
        iVar15 = iVar15 + iVar4;
        iVar12 = iVar12 + 1;
      } while (iVar2 != iVar12);
    }
    this_00 = TPZCompEl::Reference((TPZCompEl *)this);
    uVar5 = pztopology::TPZQuadrilateral::NSideNodes(side);
    TPZManVector<long,_8>::TPZManVector(&local_880,(long)(int)uVar5);
    if (0 < (int)uVar5) {
      uVar13 = 0;
      do {
        iVar12 = pztopology::TPZQuadrilateral::SideNodeLocId(side,(int)uVar13);
        pTVar9 = TPZGeoEl::Node(this_00,iVar12);
        local_880.super_TPZVec<long>.fStore[uVar13] = (long)pTVar9->fId;
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
    }
    TPZManVector<int,_9>::TPZManVector(&local_8c8,(long)iVar2);
    MVar6 = pztopology::TPZQuadrilateral::Type(side);
    if (MVar6 == EOned) {
      iVar2 = pztopology::TPZLine::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZLine::GetSideHDivPermutation(iVar2,&local_8c8.super_TPZVec<int>);
    }
    else if (MVar6 == ETriangle) {
      iVar2 = pztopology::TPZTriangle::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZTriangle::GetSideHDivPermutation(iVar2,&local_8c8.super_TPZVec<int>);
    }
    else {
      if (MVar6 != EQuadrilateral) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                   ,0x200);
      }
      iVar2 = pztopology::TPZQuadrilateral::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar2,&local_8c8.super_TPZVec<int>);
    }
    TPZVec<int>::TPZVec(&local_928,0);
    local_928.fStore = (int *)local_908;
    local_928._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdd58;
    local_928.fNElements = 9;
    local_928.fNAlloc = 0;
    lVar8 = 9;
    auVar19 = _DAT_014d28b0;
    do {
      if (SUB164(auVar19 ^ _DAT_014d28c0,4) == -0x80000000 &&
          SUB164(auVar19 ^ _DAT_014d28c0,0) < -0x7ffffff7) {
        *(uint *)((long)&local_930 + lVar8 * 4 + 4) = uVar10;
        *(uint *)((long)&local_928._vptr_TPZVec + lVar8 * 4) = uVar10;
      }
      lVar11 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar11 + 2;
      lVar8 = lVar8 + 2;
    } while (lVar8 != 0x13);
    local_948 = CONCAT44(local_948._4_4_,MVar6);
    uVar5 = pztopology::TPZQuadrilateral::SideDimension(side);
    lVar8 = (long)iVar15;
    local_258._32_8_ = local_1c8;
    local_258._16_8_ = 1;
    local_258[0x18] = '\0';
    local_258[0x19] = '\0';
    local_258._0_8_ = &PTR__TPZFMatrix_018b95f0;
    local_258._48_8_ = 0x32;
    local_258._8_8_ = lVar8;
    local_258._40_8_ = local_258._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_258 + 0x38),0);
    local_258._64_8_ = local_200;
    local_258._56_8_ = &PTR__TPZManVector_01815498;
    local_258._72_16_ = (undefined1  [16])0x0;
    local_1e8 = &PTR__TPZVec_01813df0;
    local_1e0 = (undefined1  [16])0x0;
    local_1d0 = 0;
    if (iVar15 == 0) {
      local_258._32_8_ = (double *)0x0;
    }
    else if (0x32 < iVar15) {
      local_258._32_8_ = operator_new__(lVar8 * 8);
    }
    local_258._0_8_ = &PTR__TPZFNMatrix_018b9300;
    local_480._32_8_ = local_3f0;
    local_480[0x18] = '\0';
    local_480[0x19] = '\0';
    local_480._0_8_ = &PTR__TPZFMatrix_018b95f0;
    local_480._48_8_ = 0x32;
    local_480._8_8_ = (long)(int)uVar5;
    local_480._16_8_ = lVar8;
    local_480._40_8_ = local_480._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_480 + 0x38),0);
    local_480._64_8_ = local_428;
    local_480._56_8_ = &PTR__TPZManVector_01815498;
    local_480._72_16_ = (undefined1  [16])0x0;
    local_410 = &PTR__TPZVec_01813df0;
    local_408 = (undefined1  [16])0x0;
    local_3f8 = 0;
    uVar13 = (int)uVar5 * lVar8;
    if (uVar13 == 0) {
      local_480._32_8_ = (double *)0x0;
    }
    else if (0x32 < (long)uVar13) {
      local_480._32_8_ = operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
    }
    param = local_940;
    local_480._0_8_ = &PTR__TPZFNMatrix_018b9300;
    pzshape::TPZShapeQuad::SideShape
              (side,local_940,&local_880.super_TPZVec<long>,&local_928,
               (TPZFMatrix<double> *)local_258,(TPZFMatrix<double> *)local_480);
    uVar7 = pztopology::TPZQuadrilateral::NContainedSides(side);
    local_820._0_8_ = (_func_int **)0x0;
    TPZManVector<long,_28>::TPZManVector(&local_740,(long)(int)(uVar7 + 1),(long *)local_820);
    local_958 = (ulong)uVar7;
    if (0 < (int)uVar7) {
      uVar13 = 0;
      do {
        iVar2 = pztopology::TPZQuadrilateral::ContainedSideLocId(side,(int)uVar13);
        lVar8 = local_740.super_TPZVec<long>.fStore[uVar13];
        iVar2 = pzshape::TPZShapeQuad::NConnectShapeF(iVar2,uVar10);
        local_740.super_TPZVec<long>.fStore[uVar13 + 1] = lVar8 + iVar2;
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
    }
    local_960 = 1.0;
    local_8e0.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
    local_8e0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
    local_8e0.fSide = side;
    iVar2 = (**(code **)(*(long *)this_00 + 0x208))();
    lVar8 = (long)iVar2;
    local_820._32_8_ = local_790;
    local_820[0x18] = '\0';
    local_820[0x19] = '\0';
    local_820._0_8_ = &PTR__TPZFMatrix_01816238;
    local_820._48_8_ = 9;
    local_930 = (ulong)uVar7;
    local_820._8_8_ = lVar8;
    local_820._16_8_ = lVar8;
    local_820._40_8_ = local_820._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_820 + 0x38),0);
    local_820._64_8_ = local_7c8;
    local_820._56_8_ = &PTR__TPZManVector_01815498;
    local_820._72_16_ = (undefined1  [16])0x0;
    local_7b0 = &PTR__TPZVec_01813df0;
    local_7a8 = (undefined1  [16])0x0;
    local_798 = 0;
    uVar13 = lVar8 * lVar8;
    if (iVar2 == 0) {
      local_820._32_8_ = (double *)0x0;
    }
    else if (9 < uVar13) {
      local_820._32_8_ = operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
    }
    local_820._0_8_ = &PTR__TPZFNMatrix_01815f48;
    local_640._32_8_ = local_5b0;
    local_640[0x18] = '\0';
    local_640[0x19] = '\0';
    local_640._0_8_ = &PTR__TPZFMatrix_01816238;
    local_640._48_8_ = 9;
    local_640._8_8_ = lVar8;
    local_640._16_8_ = lVar8;
    local_640._40_8_ = local_640._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_640 + 0x38),0);
    local_640._64_8_ = local_5e8;
    local_640._56_8_ = &PTR__TPZManVector_01815498;
    local_640._72_16_ = (undefined1  [16])0x0;
    local_5d0 = &PTR__TPZVec_01813df0;
    local_5c8 = (undefined1  [16])0x0;
    local_5b8 = 0;
    if (iVar2 == 0) {
      local_640._32_8_ = (double *)0x0;
    }
    else if (9 < uVar13) {
      local_640._32_8_ = operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
    }
    local_640._0_8_ = &PTR__TPZFNMatrix_01815f48;
    local_560._32_8_ = local_4d0;
    local_560._16_8_ = 3;
    local_560[0x18] = '\0';
    local_560[0x19] = '\0';
    local_560._0_8_ = &PTR__TPZFMatrix_01816238;
    local_560._48_8_ = 9;
    local_560._8_8_ = lVar8;
    local_560._40_8_ = local_560._32_8_;
    TPZVec<int>::TPZVec((TPZVec<int> *)(local_560 + 0x38),0);
    pTVar17 = local_938;
    local_560._64_8_ = local_508;
    local_560._56_8_ = &PTR__TPZManVector_01815498;
    local_560._72_16_ = (undefined1  [16])0x0;
    local_4f0 = &PTR__TPZVec_01813df0;
    local_4e8 = (undefined1  [16])0x0;
    local_4d8 = 0;
    if (iVar2 == 0) {
      local_560._32_8_ = (double *)0x0;
    }
    else if (3 < iVar2) {
      local_560._32_8_ = operator_new__(lVar8 * 0x18);
    }
    local_560._0_8_ = &PTR__TPZFNMatrix_01815f48;
    TPZGeoElSide::Jacobian
              (&local_8e0,param,(TPZFMatrix<double> *)local_820,(TPZFMatrix<double> *)local_560,
               &local_960,(TPZFMatrix<double> *)local_640);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_560,&PTR_PTR_01816200);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_640,&PTR_PTR_01816200);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_820,&PTR_PTR_01816200);
    if ((int)local_948 == 2) {
      local_960 = local_960 / 6.0;
    }
    if (0 < (int)local_958) {
      uVar13 = 0;
      do {
        local_958 = uVar13;
        uVar10 = (int)local_740.super_TPZVec<long>.fStore[local_958 + 1] -
                 (int)local_740.super_TPZVec<long>.fStore[local_958];
        if (0 < (int)uVar10) {
          local_940 = (TPZVec<double> *)
                      (long)(int)local_740.super_TPZVec<long>.fStore
                                 [local_8c8.super_TPZVec<int>.fStore[local_958]];
          local_948 = (long)(int)local_740.super_TPZVec<long>.fStore[local_958];
          lVar8 = (long)local_940 * 8;
          lVar11 = local_948 * 8;
          uVar13 = 0;
          do {
            lVar18 = (long)&local_940->_vptr_TPZVec + uVar13;
            if (((lVar18 < 0) || ((long)local_258._8_8_ <= lVar18)) || ((long)local_258._16_8_ < 1))
            {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar14 = uVar13 + local_948;
            if (((lVar14 < 0) ||
                ((pTVar17->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar14)) ||
               ((pTVar17->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pTVar17->fElem[lVar14] = *(double *)(local_258._32_8_ + lVar18 * 8) / local_960;
            if (0 < (int)uVar5) {
              uVar16 = 0;
              do {
                if ((((long)local_480._8_8_ <= (long)uVar16) || (lVar18 < 0)) ||
                   ((long)local_480._16_8_ <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar1 = (local_950->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
                if (((lVar1 <= (long)uVar16) || (lVar14 < 0)) ||
                   ((local_950->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar14)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)((long)local_950->fElem + uVar16 * 8 + lVar1 * lVar11) =
                     *(double *)(local_480._32_8_ + uVar16 * 8 + local_480._8_8_ * lVar8) /
                     local_960;
                uVar16 = uVar16 + 1;
              } while (uVar5 != uVar16);
            }
            uVar13 = uVar13 + 1;
            lVar8 = lVar8 + 8;
            lVar11 = lVar11 + 8;
            pTVar17 = local_938;
          } while (uVar13 != (uVar10 & 0x7fffffff));
        }
        uVar13 = local_958 + 1;
      } while (local_958 + 1 != local_930);
    }
    if (local_740.super_TPZVec<long>.fStore != local_740.fExtAlloc) {
      local_740.super_TPZVec<long>.fNAlloc = 0;
      local_740.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_740.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_740.super_TPZVec<long>.fStore);
      }
    }
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_480,&PTR_PTR_018b95b8);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_258,&PTR_PTR_018b95b8);
    if ((uint *)local_928.fStore != local_908) {
      local_928.fNAlloc = 0;
      local_928._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if ((uint *)local_928.fStore != (uint *)0x0) {
        operator_delete__(local_928.fStore);
      }
    }
    if (local_8c8.super_TPZVec<int>.fStore != local_8c8.fExtAlloc) {
      local_8c8.super_TPZVec<int>.fNAlloc = 0;
      local_8c8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_8c8.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_8c8.super_TPZVec<int>.fStore);
      }
    }
    if (local_880.super_TPZVec<long>.fStore != local_880.fExtAlloc) {
      local_880.super_TPZVec<long>.fNAlloc = 0;
      local_880.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_880.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_880.super_TPZVec<long>.fStore);
      }
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {

    if(side==TSHAPE::NSides || point.size() != TSHAPE::Dimension-1){
        std::cout<<"Don't have side shape associated to this side";
        DebugStop();
    }
	if(TSHAPE::SideDimension(side)!= TSHAPE::Dimension -1 ){
		return ;
	}
    int ncontained = TSHAPE::NContainedSides(side);
    int nsideshape = 0;
    int connectlocid = SideConnectLocId(0, side);
    int order = this->Connect(connectlocid).Order();
    int is;
    for (is=0; is<ncontained; is++) {
        int ic = TSHAPE::ContainedSideLocId(side,is);
        nsideshape += TSHAPE::NConnectShapeF(ic,order);
    }
#ifdef PZDEBUG
    if (nsideshape != this->NSideShapeF(side)) {
        DebugStop();
    }
#endif

    TPZGeoEl *gel = this->Reference();
    //int nc = gel->NCornerNodes();
    int nsn = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,8> id(nsn);
    for (int ic=0; ic<nsn; ic++) {
        int locid = TSHAPE::SideNodeLocId(side,ic);
        id[ic] = gel->Node(locid).Id();
    }

    //int idsize = id.size();
    TPZManVector<int,9> permutegather(ncontained);
    int transformid;


    MElementType sidetype = TSHAPE::Type(side);
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        default:
            DebugStop();
            break;
    }

    TPZManVector<int,TSHAPE::NSides> ord(TSHAPE::NSides,order);

    int sidedimension = TSHAPE::SideDimension(side);
    TPZFNMatrix<50,REAL> philoc(nsideshape,1),dphiloc(sidedimension,nsideshape);

    TSHAPE::SideShape(side,point,id,ord,philoc,dphiloc);

    int ncs = TSHAPE::NContainedSides(side);
    TPZManVector<int64_t,28> FirstIndex(ncs+1,0);
    for (int ls=0; ls<ncs; ls++) {
        int localside = TSHAPE::ContainedSideLocId(side,ls);
        FirstIndex[ls+1] = FirstIndex[ls]+TSHAPE::NConnectShapeF(localside,order);
    }

    REAL detjac = 1.;
    {
        TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
        int dim = gel->SideDimension(side);
        TPZFNMatrix<9,REAL> jac(dim,dim),jacinv(dim,dim),axes(dim,3);
        gelside.Jacobian(point, jac, axes, detjac, jacinv);
    }
    if(sidetype == ETriangle) detjac /= 6.;
    for (int side=0; side < ncs; side++) {
        int ifirst = FirstIndex[side];
        int kfirst = FirstIndex[permutegather[side]];
        int nshape = FirstIndex[side+1]-FirstIndex[side];
        for (int i=0; i<nshape; i++) {
            phi(ifirst+i,0) = philoc(kfirst+i,0)/detjac;
            for (int d=0; d< sidedimension; d++) {
                dphi(d,ifirst+i) = dphiloc(d,kfirst+i)/detjac;
            }
        }
    }

}